

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserDPOMDPFormat_Spirit.h
# Opt level: O0

void __thiscall
DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::NextFloatOfRow::operator()
          (NextFloatOfRow *this,iterator_t *str,iterator_t *end)

{
  ostream *poVar1;
  void *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_RDI;
  double d;
  size_t s;
  value_type_conflict3 *__x;
  
  if (*(int *)((long)&(in_RDI->
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start[2].
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data + 0x10) != 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "NextFloatOfRow - ERROR parsing probabilities, which");
    poVar1 = std::operator<<(poVar1," means that doubles are expected, however last found");
    poVar1 = std::operator<<(poVar1," type is #");
    this_00 = (void *)std::ostream::operator<<
                                (poVar1,*(int *)((long)&(in_RDI->
                                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start[2].
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data + 0x10));
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  this_01 = (vector<double,_std::allocator<double>_> *)
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)((in_RDI->
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + 4));
  if (this_01 == (vector<double,_std::allocator<double>_> *)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "NextFloatOfRow - ERROR _m_curMatrix contains no ");
    std::operator<<(poVar1,"elements (i.e. there are no rows to add to...).");
  }
  else {
    __x = (in_RDI->
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start[1].
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start;
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::back(in_RDI);
    std::vector<double,_std::allocator<double>_>::push_back(this_01,__x);
    *(undefined1 *)
     &(in_RDI->
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start[5].
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data = 1;
  }
  return;
}

Assistant:

void operator()(iterator_t str, iterator_t end) const
            {
                if(_m_po->_m_lp_type != DOUBLE)
                {
                    std::cout <<"NextFloatOfRow - ERROR parsing probabilities, which"
                        <<" means that doubles are expected, however last found"
                        <<" type is #"<<_m_po->_m_lp_type<<std::endl;
                }
                if(DEBUG_PARSE){//DEBUG
                    Index s =_m_po->_m_curMatrix.size();
                    std::cout <<" _m_po->_m_curMatrix.size()= " << s <<std::endl;
                    if(s>0)
                    std::cout <<" _m_po->_m_curMatrix.back().size()= " <<
                        _m_po->_m_curMatrix.back().size()<<std::endl;
                }
                size_t s =_m_po->_m_curMatrix.size();
                if(s > 0)
                {
                    double d = _m_po->_m_lp_double;
                    //_m_curMatrix.back() isa  vector<double>
                    _m_po->_m_curMatrix.back().push_back(d);
                    _m_po->_m_matrixModified = true;
                }
                else
                    std::cout << "NextFloatOfRow - ERROR _m_curMatrix contains no "<<
                        "elements (i.e. there are no rows to add to...).";

                if(DEBUG_PARSE){//DEBUG
                    size_t s =_m_po->_m_curMatrix.size();
                    std::cout <<" _m_po->_m_curMatrix.size()= " << s <<std::endl;
                    if(s>0)
                    std::cout <<" _m_po->_m_curMatrix.back().size()= " <<
                        _m_po->_m_curMatrix.back().size()<<std::endl;
                }

            }